

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

transaction<pstore::lock_guard<pstore::transaction_mutex>_> *
pstore::begin(transaction<pstore::lock_guard<pstore::transaction_mutex>_> *__return_storage_ptr__,
             database *db)

{
  lock_guard<pstore::transaction_mutex> local_60;
  range_lock local_38;
  
  transaction_mutex::transaction_mutex((transaction_mutex *)&local_38,db);
  lock_guard<pstore::transaction_mutex>::lock_guard(&local_60,(transaction_mutex *)&local_38);
  transaction<pstore::lock_guard<pstore::transaction_mutex>_>::transaction
            (__return_storage_ptr__,db,&local_60);
  lock_guard<pstore::transaction_mutex>::~lock_guard(&local_60);
  file::range_lock::~range_lock(&local_38);
  return __return_storage_ptr__;
}

Assistant:

transaction<transaction_lock> begin (database & db) {
        return begin (db, transaction_lock{transaction_mutex{db}});
    }